

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::notify_log_append_completion(raft_server *this,bool ok)

{
  element_type *peVar1;
  ulong uVar2;
  long *plVar3;
  int iVar4;
  ulong target_idx;
  char *pcVar5;
  unique_lock<std::recursive_mutex> guard;
  string local_40;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 5 < iVar4)) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar5 = "FAILED";
    if (ok) {
      pcVar5 = "OK";
    }
    msg_if_given_abi_cxx11_(&local_40,"got log append completion notification: %s",pcVar5);
    (*peVar1->_vptr_logger[8])
              (peVar1,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"notify_log_append_completion",0x4c0,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((this->role_)._M_i == leader) {
    std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
    if (ok) {
      uVar2 = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
      target_idx = get_expected_committed_log_idx(this);
      commit(this,target_idx);
      if (uVar2 < (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i) {
        request_append_entries_for_all(this);
      }
    }
    else {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 1 < iVar4)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_40,"log appending failed, resign immediately");
        (*peVar1->_vptr_logger[8])
                  (peVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"notify_log_append_completion",0x4c6,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      LOCK();
      (this->leader_).super___atomic_base<int>._M_i = -1;
      UNLOCK();
      become_follower(this);
      LOCK();
      (this->hb_alive_)._M_base._M_i = false;
      UNLOCK();
    }
  }
  else {
    if (ok) {
      EventAwaiter::invoke(this->ea_follower_log_append_);
      return;
    }
    std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 0 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_40,"log appending failed, stop this server");
      (*peVar1->_vptr_logger[8])
                (peVar1,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"notify_log_append_completion",0x4de,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    plVar3 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_
                        ).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar3 + 0x40))(plVar3,0xffffffffffffffeb);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::notify_log_append_completion(bool ok) {
    p_tr("got log append completion notification: %s", ok ? "OK" : "FAILED");

    if (role_ == srv_role::leader) {
        recur_lock(lock_);
        if (!ok) {
            // If log appending fails, leader should resign immediately.
            p_er("log appending failed, resign immediately");
            leader_ = -1;
            become_follower();

            // Clear this flag to avoid pre-vote rejection.
            hb_alive_ = false;
            return;
        }

        // Leader: commit the log and send append_entries request, if needed.
        uint64_t prev_committed_index = quick_commit_index_.load();
        uint64_t committed_index = get_expected_committed_log_idx();
        commit( committed_index );

        if (quick_commit_index_ > prev_committed_index) {
            // Commit index has been changed as a result of log appending.
            // Send replication messages.
            request_append_entries_for_all();
        }
    } else {
        if (!ok) {
            // If log appending fails for follower, there is no way to proceed it.
            // We should stop the server immediately.
            recur_lock(lock_);
            p_ft("log appending failed, stop this server");
            ctx_->state_mgr_->system_exit(N21_log_flush_failed);
            return;
        }

        // Follower: wake up the waiting thread.
        ea_follower_log_append_->invoke();
    }
}